

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O0

void __thiscall
SGParser::Generator::RegExprDFAParseElement::ShiftToken
          (RegExprDFAParseElement *this,TokenType *token,
          TokenStream<SGParser::Generator::RegExprParseToken> *stream)

{
  long lVar1;
  RegExprParseToken local_28;
  TokenType tempToken;
  TokenStream<SGParser::Generator::RegExprParseToken> *stream_local;
  TokenType *token_local;
  RegExprDFAParseElement *this_local;
  
  (this->field_1).ch = token->ch;
  if (((this->field_1).ch == 0x5c) && ((token->super_TokenCode).Code != 1)) {
    tempToken = (TokenType)stream;
    RegExprParseToken::RegExprParseToken(&local_28);
    lVar1 = (**(code **)(*(long *)tempToken + 0x10))(tempToken,&local_28);
    (this->field_1).ch = *(uint *)(lVar1 + 4);
    switch((this->field_1).ch) {
    case 0x62:
      (this->field_1).ch = 8;
      break;
    default:
      break;
    case 0x66:
      (this->field_1).ch = 0xc;
      break;
    case 0x6e:
      (this->field_1).ch = 10;
      break;
    case 0x72:
      (this->field_1).ch = 0xd;
      break;
    case 0x74:
      (this->field_1).ch = 9;
      break;
    case 0x76:
      (this->field_1).ch = 0xb;
    }
  }
  return;
}

Assistant:

void ShiftToken(TokenType& token, TokenStream<TokenType>& stream) {
        ch = token.ch;
        // If we are shifting token, parser will be looking at the next character next
        // So we can do this
        // Essentially, we are ignoring the next token code, and turning it into a character
        if (ch == '\\' && token.Code != TokenCode::TokenEOF) {
            TokenType tempToken;
            ch = stream.GetNextToken(tempToken).ch;
            // Process characters with special meanings
            switch (ch) {
                case 'n': ch='\n'; break;
                case 't': ch='\t'; break;
                case 'v': ch='\v'; break;
                case 'r': ch='\r'; break;
                case 'f': ch='\f'; break;
                case 'b': ch='\b'; break;
                default:           break;
            }
        }
    }